

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

shared_ptr<notch::core::FullyConnectedLayer> __thiscall notch::core::MakeLayer::FC(MakeLayer *this)

{
  bool bVar1;
  element_type *__args_1;
  element_type *__args_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  MakeLayer *in_RSI;
  shared_ptr<notch::core::FullyConnectedLayer> sVar3;
  allocator local_39;
  string local_38 [40];
  MakeLayer *this_local;
  
  if (in_RSI->maybeActivation == (Activation *)0x0) {
    in_RSI->maybeActivation = (Activation *)linearActivation;
  }
  this_local = this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RSI->maybeWeights);
  if ((bVar1) &&
     (bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RSI->maybeBias), bVar1)
     ) {
    __args_1 = std::
               __shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&in_RSI->maybeWeights);
    __args_2 = std::
               __shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&in_RSI->maybeBias);
    sVar3 = ::std::
            make_shared<notch::core::FullyConnectedLayer,std::valarray<float>&,std::valarray<float>&,notch::core::Activation_const&>
                      ((valarray<float> *)this,__args_1,(Activation *)__args_2);
    _Var2 = sVar3.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else if ((in_RSI->nInputs == 0) || (in_RSI->nOutputs == 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"a FullyConnectedLayer",&local_39);
    logic_error(in_RSI,(string *)local_38);
    ::std::__cxx11::string::~string(local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::shared_ptr<notch::core::FullyConnectedLayer>::shared_ptr
              ((shared_ptr<notch::core::FullyConnectedLayer> *)this,(nullptr_t)0x0);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    sVar3 = ::std::
            make_shared<notch::core::FullyConnectedLayer,unsigned_long&,unsigned_long&,notch::core::Activation_const&>
                      (&this->nInputs,&in_RSI->nInputs,(Activation *)&in_RSI->nOutputs);
    _Var2 = sVar3.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<notch::core::FullyConnectedLayer>)
         sVar3.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FullyConnectedLayer> FC() {
        if (!maybeActivation) {
            maybeActivation = &linearActivation;
        }
        if (maybeWeights && maybeBias) {
            return std::make_shared<FullyConnectedLayer>
                (*maybeWeights, *maybeBias, *maybeActivation);
        } else if (nInputs && nOutputs) {
            return std::make_shared<FullyConnectedLayer>
                (nInputs, nOutputs, *maybeActivation);
        } else {
            logic_error("a FullyConnectedLayer");
            return nullptr; // unreachable
        }
    }